

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx2::forward_int8_x86
          (InnerProduct_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar6;
  undefined1 uVar7;
  float *pfVar8;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  float scale_in;
  int p_2;
  Mat scale_data;
  int *outptr_1;
  char w;
  char val;
  int i_1;
  char *sptr_1;
  char *kptr_1;
  int sum;
  int p_1;
  int *outptr;
  __m128i _s1;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int i;
  char *sptr;
  char *kptr;
  __m128i _sum1;
  __m128i _sum0;
  int p;
  Mat top_blob_int32;
  int out_elempack;
  Option opt_flatten;
  Mat bottom_blob_int8_flattened;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  Option opt_unpack;
  Mat bottom_blob_unpacked;
  int num_input;
  Mat *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  undefined8 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  float fVar9;
  undefined8 in_stack_fffffffffffff968;
  int iVar10;
  Mat *in_stack_fffffffffffff970;
  Option *in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  int _elempack;
  Mat *in_stack_fffffffffffff988;
  Mat *in_stack_fffffffffffff990;
  undefined8 local_658;
  Option *pOStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  Option *in_stack_fffffffffffffa48;
  Mat *in_stack_fffffffffffffa50;
  Mat *in_stack_fffffffffffffa58;
  undefined6 in_stack_fffffffffffffa60;
  undefined2 in_stack_fffffffffffffa66;
  Option *in_stack_fffffffffffffa90;
  Mat *in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  undefined2 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  float local_538;
  int local_534;
  Mat local_530;
  int *local_4e8;
  char local_4de;
  char local_4dd;
  int local_4dc;
  char *local_4d8;
  char *local_4d0;
  int local_4c8;
  int local_4c4;
  int *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  Option *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  Mat *in_stack_fffffffffffffb88;
  InnerProduct *in_stack_fffffffffffffb90;
  int local_44c;
  char *local_448;
  ulong *local_440;
  undefined8 local_438;
  Option *pOStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  int local_40c;
  Mat local_408;
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_380;
  Mat local_370;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined1 local_308 [32];
  undefined1 local_2e0 [40];
  int local_2b8;
  int local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  Mat local_240;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  int local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ushort local_18a;
  ulong local_188;
  undefined8 uStack_180;
  ulong *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  undefined8 uStack_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Option *pOStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Option *pOStack_60;
  int *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int *local_30;
  undefined1 local_28 [16];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
  _elempack = (int)((ulong)in_stack_fffffffffffff980 >> 0x20);
  local_1f4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_1f0 = in_RCX;
  if (((in_RSI->dims == 2) && (in_RSI->w == local_1f4)) && (1 < in_RSI->h * in_RSI->elempack)) {
    ncnn::Mat::Mat(&local_240);
    local_288 = *local_1f0;
    uStack_278 = local_1f0[2];
    uStack_270 = local_1f0[3];
    local_268 = local_1f0[4];
    uStack_260 = local_1f0[5];
    uStack_258 = local_1f0[6];
    uStack_250 = local_1f0[7];
    uStack_280 = local_1f0[2];
    convert_packing(in_stack_fffffffffffff990,in_stack_fffffffffffff988,_elempack,
                    in_stack_fffffffffffff978);
    local_1cc = InnerProduct::forward_int8
                          (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                           in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    ncnn::Mat::~Mat((Mat *)0x42579b);
  }
  else {
    local_1e8 = in_RDX;
    local_298 = ncnn::Mat::elembits(in_RSI);
    ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
    local_40c = in_stack_fffffffffffffaac;
    if (local_298 != 8) {
      local_328 = *local_1f0;
      uStack_318 = local_1f0[2];
      uStack_310 = local_1f0[3];
      local_308 = *(undefined1 (*) [32])(local_1f0 + 4);
      uStack_320 = local_1f0[2];
      quantize_to_int8((Mat *)CONCAT26(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60),
                       in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                      );
      local_40c = in_stack_fffffffffffffaac;
    }
    ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
    if (local_2b8 != 1) {
      local_3b8 = *local_1f0;
      uStack_3a8 = local_1f0[2];
      uStack_3a0 = local_1f0[3];
      local_398 = local_1f0[4];
      uStack_390 = local_1f0[5];
      uStack_388 = local_1f0[6];
      uStack_380 = local_1f0[7];
      uStack_3b0 = local_1f0[2];
      (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],local_2e0,&local_370,&local_3b8);
    }
    local_3bc = 1;
    if (((*(byte *)((long)local_1f0 + 0x27) & 1) != 0) &&
       (local_3bc = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0)) {
      local_3bc = 8;
    }
    ncnn::Mat::create(in_stack_fffffffffffff970,iVar10,
                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                      (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    uVar6 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    if ((bool)uVar6) {
      local_1cc = -100;
      local_3c0 = 1;
    }
    else {
      ncnn::Mat::Mat(&local_408);
      ncnn::Mat::create(in_stack_fffffffffffff970,iVar10,
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                        (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      uVar7 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950))
      ;
      if ((bool)uVar7) {
        local_1cc = -100;
        local_3c0 = 1;
      }
      else {
        if (local_3bc == 8) {
          for (local_40c = 0;
              local_40c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_3bc;
              local_40c = local_40c + 1) {
            local_1a8 = 0;
            uStack_1a0 = 0;
            in_stack_fffffffffffffa98 = (Mat *)0x0;
            in_stack_fffffffffffffaa0 = (Mat *)0x0;
            local_428 = 0;
            uStack_420 = 0;
            local_1b8._8_8_ = SUB168(ZEXT816(0),4);
            local_438 = 0;
            pOStack_430 = (Option *)local_1b8._8_8_;
            in_stack_fffffffffffffa90 = (Option *)local_1b8._8_8_;
            local_1b8 = ZEXT816(0) << 0x20;
            local_440 = (ulong *)ncnn::Mat::row<signed_char_const>((Mat *)(in_RDI + 0x15),local_40c)
            ;
            local_448 = ncnn::Mat::operator_cast_to_signed_char_(&local_370);
            for (local_44c = 0; local_44c < local_1f4; local_44c = local_44c + 1) {
              local_18a = (ushort)*local_448;
              auVar1 = vpinsrw_avx(ZEXT216(local_18a),(uint)local_18a,1);
              auVar1 = vpinsrw_avx(auVar1,(uint)local_18a,2);
              auVar1 = vpinsrw_avx(auVar1,(uint)local_18a,3);
              auVar1 = vpinsrw_avx(auVar1,(uint)local_18a,4);
              auVar1 = vpinsrw_avx(auVar1,(uint)local_18a,5);
              auVar1 = vpinsrw_avx(auVar1,(uint)local_18a,6);
              local_28 = vpinsrw_avx(auVar1,(uint)local_18a,7);
              local_170 = local_440;
              local_188 = *local_440;
              uStack_180 = 0;
              local_1c8._8_8_ = SUB168(ZEXT816(0),4);
              local_138 = 0;
              uStack_130 = local_1c8._8_8_;
              uStack_140 = 0;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_1c8._8_8_;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_188;
              auVar1 = vpcmpgtb_avx(auVar5 << 0x40,auVar1);
              local_5e8 = auVar1._0_8_;
              local_168 = local_5e8;
              uStack_5e0 = auVar1._8_8_;
              uStack_160 = uStack_5e0;
              uStack_150 = 0;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_188;
              auVar1 = vpunpcklbw_avx(auVar2,auVar1);
              local_5f8 = auVar1._0_8_;
              uStack_5f0 = auVar1._8_8_;
              local_118 = local_28._0_8_;
              uStack_110 = local_28._8_8_;
              local_128 = local_5f8;
              uStack_120 = uStack_5f0;
              auVar2 = vpmullw_avx(local_28,auVar1);
              local_608 = auVar2._0_8_;
              uStack_600 = auVar2._8_8_;
              local_f8 = local_28._0_8_;
              uStack_f0 = local_28._8_8_;
              local_108 = local_5f8;
              uStack_100 = uStack_5f0;
              auVar1 = vpmulhw_avx(local_28,auVar1);
              local_618 = auVar1._0_8_;
              local_498 = local_618;
              uStack_610 = auVar1._8_8_;
              uStack_490 = uStack_610;
              local_d8 = local_608;
              uStack_d0 = uStack_600;
              local_e8 = local_618;
              uStack_e0 = uStack_610;
              auVar3 = vpunpcklwd_avx(auVar2,auVar1);
              local_628 = auVar3._0_8_;
              local_4a8 = local_628;
              uStack_620 = auVar3._8_8_;
              uStack_4a0 = uStack_620;
              local_b8 = local_608;
              uStack_b0 = uStack_600;
              local_c8 = local_618;
              uStack_c0 = uStack_610;
              auVar2 = vpunpckhwd_avx(auVar2,auVar1);
              local_638 = auVar2._0_8_;
              local_4b8 = local_638;
              uStack_630 = auVar2._8_8_;
              uStack_4b0 = uStack_630;
              local_78 = local_428;
              uStack_70 = uStack_420;
              local_88 = local_628;
              uStack_80 = uStack_620;
              auVar4._8_8_ = uStack_420;
              auVar4._0_8_ = local_428;
              auVar1 = vpaddd_avx(auVar4,auVar3);
              local_648 = auVar1._0_8_;
              local_428 = local_648;
              uStack_640 = auVar1._8_8_;
              uStack_420 = uStack_640;
              local_98 = local_438;
              pOStack_90 = pOStack_430;
              local_a8 = local_638;
              uStack_a0 = uStack_630;
              auVar3._8_8_ = pOStack_430;
              auVar3._0_8_ = local_438;
              auVar1 = vpaddd_avx(auVar3,auVar2);
              local_658 = auVar1._0_8_;
              local_438 = local_658;
              pOStack_650 = auVar1._8_8_;
              pOStack_430 = pOStack_650;
              local_448 = local_448 + 1;
              local_440 = local_440 + 1;
              local_1c8 = ZEXT816(0) << 0x20;
              local_158 = local_188;
              local_148 = local_188;
              local_10 = local_18a;
              local_e = local_18a;
              local_c = local_18a;
              local_a = local_18a;
              local_8 = local_18a;
              local_6 = local_18a;
              local_4 = local_18a;
              local_2 = local_18a;
            }
            local_4c0 = ncnn::Mat::operator_cast_to_int_(&local_408);
            local_30 = local_4c0 + (local_40c << 3);
            local_48 = local_428;
            uStack_40 = uStack_420;
            *(undefined8 *)local_30 = local_428;
            *(undefined8 *)(local_30 + 2) = uStack_420;
            local_50 = local_4c0 + (long)(local_40c << 3) + 4;
            local_68 = local_438;
            pOStack_60 = pOStack_430;
            *(undefined8 *)local_50 = local_438;
            *(Option **)(local_4c0 + (long)(local_40c << 3) + 6) = pOStack_430;
          }
        }
        iVar10 = (int)((ulong)in_stack_fffffffffffff958 >> 0x20);
        if (local_3bc == 1) {
          for (local_4c4 = 0; iVar10 = (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
              local_4c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_3bc;
              local_4c4 = local_4c4 + 1) {
            local_4c8 = 0;
            local_4d0 = ncnn::Mat::row<signed_char_const>((Mat *)(in_RDI + 0x15),local_4c4);
            local_4d8 = ncnn::Mat::operator_cast_to_signed_char_(&local_370);
            for (local_4dc = 0; local_4dc < local_1f4; local_4dc = local_4dc + 1) {
              local_4dd = *local_4d8;
              local_4de = *local_4d0;
              local_4c8 = (int)local_4dd * (int)local_4de + local_4c8;
              local_4d8 = local_4d8 + 1;
              local_4d0 = local_4d0 + 1;
            }
            local_4e8 = ncnn::Mat::operator_cast_to_int_(&local_408);
            local_4e8[local_4c4] = local_4c8;
          }
        }
        ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),iVar10,
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       (Allocator *)in_stack_fffffffffffff948);
        for (local_534 = 0; local_534 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_534 = local_534 + 1) {
          pfVar8 = ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                              (long)local_534);
          if ((*pfVar8 != 0.0) || (NAN(*pfVar8))) {
            pfVar8 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x208),0);
            fVar9 = *pfVar8;
            pfVar8 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                                (long)local_534);
            local_538 = 1.0 / (fVar9 * *pfVar8);
          }
          else {
            local_538 = 0.0;
          }
          pfVar8 = ncnn::Mat::operator[](&local_530,(long)local_534);
          *pfVar8 = local_538;
        }
        dequantize_from_int32
                  ((Mat *)CONCAT44(in_stack_fffffffffffffab4,
                                   CONCAT13(uVar6,CONCAT12(uVar7,in_stack_fffffffffffffab0))),
                   (Mat *)CONCAT44(local_40c,in_stack_fffffffffffffaa8),in_stack_fffffffffffffaa0,
                   in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        if (in_RDI[2] != 0) {
          (**(code **)(*(long *)in_RDI[2] + 0x48))((long *)in_RDI[2],local_1e8,local_1f0);
        }
        local_1cc = 0;
        local_3c0 = 1;
        ncnn::Mat::~Mat((Mat *)0x4264cc);
      }
      ncnn::Mat::~Mat((Mat *)0x4264d9);
    }
    ncnn::Mat::~Mat((Mat *)0x4264f7);
    ncnn::Mat::~Mat((Mat *)0x426504);
  }
  return local_1cc;
}

Assistant:

int InnerProduct_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        Mat bottom_blob_unpacked;
        Option opt_unpack = opt;
        opt_unpack.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_unpack);

        return forward_int8(bottom_blob_unpacked, top_blob, opt);
    }

    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    Mat bottom_blob_int8_flattened = bottom_blob_int8;
    if (bottom_blob_int8.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;
        flatten->forward(bottom_blob_int8, bottom_blob_int8_flattened, opt_flatten);
    }

    //     int elempack = bottom_blob_int8_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__
    //     size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat top_blob_int32;
    top_blob_int32.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (out_elempack == 8)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                __m128i _val = _mm_set1_epi16((short)sptr[0]);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                __m128i _sl = _mm_mullo_epi16(_val, _w);
                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                _sum0 = _mm_add_epi32(_sum0, _s0);
                _sum1 = _mm_add_epi32(_sum1, _s1);

                sptr += 1;
                kptr += 8;
            }

            int* outptr = (int*)top_blob_int32;
            _mm_storeu_si128((__m128i*)(outptr + p * 8), _sum0);
            _mm_storeu_si128((__m128i*)(outptr + p * 8 + 4), _sum1);
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            int sum = 0;

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                signed char val = sptr[0];

                signed char w = kptr[0];

                sum += val * w;

                sptr += 1;
                kptr += 1;
            }

            int* outptr = (int*)top_blob_int32;
            outptr[p] = sum;
        }
    }

    Mat scale_data(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_data[p] = scale_in;
    }

    dequantize_from_int32(top_blob_int32, top_blob, scale_data, bias_data, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}